

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
vkt::shaderexecutor::
Apply<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::doPrintExpr(Apply<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *this,ostream *os)

{
  BaseArgExprs args;
  ExprBase *local_30;
  void *local_28;
  undefined8 uStack_20;
  long local_18;
  
  local_28 = (void *)0x0;
  uStack_20 = 0;
  local_18 = 0;
  local_30 = &((this->m_args).a.super_ContainerExprPBase<tcu::Vector<float,_3>_>.
               super_ExprPBase<tcu::Vector<float,_3>_>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_3>_>_>.m_ptr)->
              super_ExprBase;
  std::
  vector<vkt::shaderexecutor::ExprBase_const*,std::allocator<vkt::shaderexecutor::ExprBase_const*>>
  ::emplace_back<vkt::shaderexecutor::ExprBase_const*>
            ((vector<vkt::shaderexecutor::ExprBase_const*,std::allocator<vkt::shaderexecutor::ExprBase_const*>>
              *)&local_28,&local_30);
  local_30 = &((this->m_args).b.super_ExprPBase<float>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr)->super_ExprBase;
  std::
  vector<vkt::shaderexecutor::ExprBase_const*,std::allocator<vkt::shaderexecutor::ExprBase_const*>>
  ::emplace_back<vkt::shaderexecutor::ExprBase_const*>
            ((vector<vkt::shaderexecutor::ExprBase_const*,std::allocator<vkt::shaderexecutor::ExprBase_const*>>
              *)&local_28,&local_30);
  local_30 = &((this->m_args).c.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
               super_ExprPBase<vkt::shaderexecutor::Void>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_ptr)->
              super_ExprBase;
  std::
  vector<vkt::shaderexecutor::ExprBase_const*,std::allocator<vkt::shaderexecutor::ExprBase_const*>>
  ::emplace_back<vkt::shaderexecutor::ExprBase_const*>
            ((vector<vkt::shaderexecutor::ExprBase_const*,std::allocator<vkt::shaderexecutor::ExprBase_const*>>
              *)&local_28,&local_30);
  local_30 = &((this->m_args).d.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
               super_ExprPBase<vkt::shaderexecutor::Void>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_ptr)->
              super_ExprBase;
  std::
  vector<vkt::shaderexecutor::ExprBase_const*,std::allocator<vkt::shaderexecutor::ExprBase_const*>>
  ::emplace_back<vkt::shaderexecutor::ExprBase_const*>
            ((vector<vkt::shaderexecutor::ExprBase_const*,std::allocator<vkt::shaderexecutor::ExprBase_const*>>
              *)&local_28,&local_30);
  (**(code **)(*(long *)this->m_func + 0x20))(this->m_func,os,&local_28);
  if (local_28 != (void *)0x0) {
    operator_delete(local_28,local_18 - (long)local_28);
  }
  return;
}

Assistant:

void				doPrintExpr			(ostream& os) const
	{
		BaseArgExprs	args;
		args.push_back(m_args.a.get());
		args.push_back(m_args.b.get());
		args.push_back(m_args.c.get());
		args.push_back(m_args.d.get());
		m_func.print(os, args);
	}